

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall
capnp::compiler::Compiler::Impl::eagerlyCompile
          (Impl *this,uint64_t id,uint eagerness,SchemaLoader *finalLoader)

{
  RemoveConst<capnp::schema::Node::SourceInfo::Reader> *pRVar1;
  Maybe<capnp::compiler::Compiler::Node_&> this_00;
  Reader *reader;
  undefined8 uVar2;
  Reader *sourceInfo;
  StructReader *this_01;
  MessageSizeCounts MVar3;
  ArrayPtr<capnp::word> AVar4;
  ArrayPtr<capnp::word> uncheckedBuffer;
  uint64_t id_local;
  Vector<capnp::schema::Node::SourceInfo::Reader> sourceInfos;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  seen;
  Reader local_98;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  StructDataBitCount local_40;
  StructPointerCount SStack_3c;
  undefined2 uStack_3a;
  int iStack_38;
  undefined4 uStack_34;
  
  id_local = id;
  this_00 = findNode(this,id);
  if (this_00.ptr != (Node *)0x0) {
    seen._M_h._M_buckets = &seen._M_h._M_single_bucket;
    seen._M_h._M_bucket_count = 1;
    seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    seen._M_h._M_element_count = 0;
    seen._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    seen._M_h._M_rehash_policy._M_next_resize = 0;
    seen._M_h._M_single_bucket = (__node_base_ptr)0x0;
    sourceInfos.builder.ptr = (Reader *)0x0;
    sourceInfos.builder.pos = (RemoveConst<capnp::schema::Node::SourceInfo::Reader> *)0x0;
    sourceInfos.builder.endPtr = (Reader *)0x0;
    Node::traverse(this_00.ptr,eagerness,&seen,finalLoader,&sourceInfos);
    pRVar1 = sourceInfos.builder.pos;
    for (this_01 = &(sourceInfos.builder.ptr)->_reader; this_01 != &pRVar1->_reader;
        this_01 = this_01 + 1) {
      MVar3 = capnp::_::StructReader::totalSize(this_01);
      AVar4 = kj::Arena::allocateArray<capnp::word>(&this->nodeArena,MVar3.wordCount + 1);
      uncheckedBuffer.ptr = (word *)AVar4.size_;
      reader = (Reader *)AVar4.ptr;
      memset(reader,0,(long)uncheckedBuffer.ptr << 3);
      uncheckedBuffer.size_ = (size_t)finalLoader;
      copyToUnchecked<capnp::schema::Node::SourceInfo::Reader&>
                ((capnp *)this_01,reader,uncheckedBuffer);
      if (this_01->dataSize < 0x40) {
        uVar2 = 0;
      }
      else {
        uVar2 = *this_01->data;
      }
      readMessageUnchecked<capnp::schema::Node::SourceInfo>(&local_98,(word *)reader);
      local_40 = local_98._reader.dataSize;
      SStack_3c = local_98._reader.pointerCount;
      uStack_3a = local_98._reader._38_2_;
      iStack_38 = local_98._reader.nestingLimit;
      uStack_34 = local_98._reader._44_4_;
      local_50 = local_98._reader.data._0_4_;
      uStack_4c = local_98._reader.data._4_4_;
      uStack_48 = local_98._reader.pointers._0_4_;
      uStack_44 = local_98._reader.pointers._4_4_;
      local_60 = local_98._reader.segment._0_4_;
      uStack_5c = local_98._reader.segment._4_4_;
      uStack_58 = local_98._reader.capTable._0_4_;
      uStack_54 = local_98._reader.capTable._4_4_;
      local_68 = uVar2;
      std::
      _Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_long,capnp::schema::Node::SourceInfo::Reader>>
                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>,std::allocator<std::pair<unsigned_long_const,capnp::schema::Node::SourceInfo::Reader>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->sourceInfoById,&local_68);
    }
    kj::ArrayBuilder<capnp::schema::Node::SourceInfo::Reader>::dispose(&sourceInfos.builder);
    std::
    _Hashtable<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&seen._M_h);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36],unsigned_long&>
            ((Fault *)&seen,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x50f,FAILED,(char *)0x0,"\"id did not come from this Compiler.\", id",
             (char (*) [36])"id did not come from this Compiler.",&id_local);
  kj::_::Debug::Fault::fatal((Fault *)&seen);
}

Assistant:

void Compiler::Impl::eagerlyCompile(uint64_t id, uint eagerness,
                                    const SchemaLoader& finalLoader) {
  KJ_IF_MAYBE(node, findNode(id)) {
    std::unordered_map<Node*, uint> seen;
    kj::Vector<schema::Node::SourceInfo::Reader> sourceInfos;
    node->traverse(eagerness, seen, finalLoader, sourceInfos);

    // Copy the SourceInfo structures into permanent space so that they aren't invalidated when
    // clearWorkspace() is called.
    for (auto& sourceInfo: sourceInfos) {
      auto words = nodeArena.allocateArray<word>(sourceInfo.totalSize().wordCount + 1);
      memset(words.begin(), 0, words.asBytes().size());
      copyToUnchecked(sourceInfo, words);
      sourceInfoById.insert(std::make_pair(sourceInfo.getId(),
          readMessageUnchecked<schema::Node::SourceInfo>(words.begin())));
    }
  } else {
    KJ_FAIL_REQUIRE("id did not come from this Compiler.", id);
  }
}